

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.cpp
# Opt level: O2

string * __thiscall
SymbolTableTree::GetCurrentPreviousTableName_abi_cxx11_
          (string *__return_storage_ptr__,SymbolTableTree *this)

{
  __type _Var1;
  pointer __lhs;
  
  for (__lhs = (this->m_table_tree).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __lhs != (this->m_table_tree).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
    _Var1 = std::operator==(&__lhs->first,&this->current_table_name);
    if (_Var1) break;
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&(__lhs->second).m_previous_level_name);
  return __return_storage_ptr__;
}

Assistant:

string SymbolTableTree::GetCurrentPreviousTableName() const {
    auto iter = m_table_tree.begin();
    for (; iter != m_table_tree.end(); ++iter) {
        if (iter->first == current_table_name)
            break;
    }
    return iter->second.GetPreviousTableName();
}